

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_set_standard_lookup.c
# Opt level: O0

void cleanup(EVP_PKEY_CTX *ctx)

{
  archive_string *as;
  mtree_entry *pmVar1;
  mtree_entry *q;
  mtree_entry *p;
  mtree *mtree;
  archive_read *a_local;
  
  as = (archive_string *)**(undefined8 **)(ctx + 0x818);
  q = (mtree_entry *)as[2].buffer_length;
  while (q != (mtree_entry *)0x0) {
    pmVar1 = q->next;
    free(q->name);
    free_options(q->options);
    free(q);
    q = pmVar1;
  }
  archive_string_free(as);
  archive_string_free(as + 4);
  archive_string_free(as + 5);
  archive_entry_linkresolver_free((archive_entry_linkresolver *)as[6].s);
  free((void *)as[1].length);
  free(as);
  **(undefined8 **)(ctx + 0x818) = 0;
  return;
}

Assistant:

static void
cleanup(void *data)
{
	struct name_cache *cache = (struct name_cache *)data;
	size_t i;

	if (cache != NULL) {
		for (i = 0; i < cache->size; i++) {
			if (cache->cache[i].name != NULL &&
			    cache->cache[i].name != NO_NAME)
				free((void *)(uintptr_t)cache->cache[i].name);
		}
		free(cache->buff);
		free(cache);
	}
}